

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

config_value * parser_parse_value(parser *parser,char *value)

{
  list *plVar1;
  parser_token pVar2;
  natwm_error nVar3;
  size_t sVar4;
  map_entry *pmVar5;
  config_value *pcVar6;
  node *pnVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  undefined8 in_R9;
  size_t sVar11;
  size_t value_items_length;
  void *__ptr;
  undefined8 uVar12;
  size_t local_70;
  size_t array_string_length;
  char *array_string;
  parser *local_58;
  size_t local_50;
  size_t raw_string_length;
  list *local_40;
  char *local_38;
  char *array_value_items_string;
  
  uVar12 = 0x106d77;
  pVar2 = char_to_token(*value);
  switch(pVar2) {
  case ALPHA_CHAR:
    local_38 = (char *)((ulong)local_38 & 0xffffffffffffff00);
    nVar3 = string_to_boolean(value,(_Bool *)&local_38);
    if (nVar3 == NO_ERROR) {
      pcVar6 = config_value_create_boolean(local_38._0_1_);
LAB_00106de5:
      if (pcVar6 == (config_value *)0x0) {
        return (config_value *)0x0;
      }
LAB_00106f58:
      free(value);
      return pcVar6;
    }
    sVar10 = parser->line_num;
    pcVar9 = "Invalid boolean value \'%s\' found - Line %zu";
    break;
  case ARRAY_START:
    sVar4 = strlen(value);
    pVar2 = char_to_token(value[sVar4 - 1]);
    local_58 = parser;
    if (pVar2 == ARRAY_END) {
      pcVar9 = string_init(value);
    }
    else {
      local_38 = (char *)0x0;
      local_50 = 0;
      nVar3 = array_context_get_delimiter(parser->buffer + parser->pos,']',&local_38,&local_50,true)
      ;
      pcVar9 = local_38;
      if (nVar3 != NO_ERROR) {
LAB_0010703c:
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Could not find \']\' in array value string - Line %zu",parser->line_num);
        return (config_value *)0x0;
      }
      array_string_length = 0;
      local_70 = 0;
      nVar3 = string_strip_surrounding_spaces(local_38,(char **)&array_string_length,&local_70);
      free(pcVar9);
      pcVar9 = (char *)array_string_length;
      sVar10 = local_50;
      if (nVar3 != NO_ERROR) goto LAB_0010703c;
      while (sVar10 - 1 != 0) {
        parser_increment(parser);
        sVar10 = sVar10 - 1;
      }
    }
    local_38 = (char *)0x0;
    local_50 = 0;
    sVar4 = strlen(pcVar9);
    nVar3 = string_splice(pcVar9,1,sVar4 - 1,&local_38,&local_50);
    free(pcVar9);
    pcVar9 = local_38;
    if (nVar3 != NO_ERROR) {
      return (config_value *)0x0;
    }
    local_40 = list_create();
    if (local_40 != (list *)0x0) {
      raw_string_length = (size_t)pcVar9;
      while( true ) {
        local_38 = (char *)0x0;
        local_50 = 0;
        nVar3 = array_context_get_delimiter(pcVar9,',',&local_38,&local_50,false);
        if (nVar3 != NO_ERROR) break;
        list_insert(local_40,local_38);
        pcVar9 = pcVar9 + local_50 + 1;
      }
      if ((nVar3 == NOT_FOUND_ERROR) &&
         (pcVar9 = string_init(pcVar9), plVar1 = local_40, pcVar9 != (char *)0x0)) {
        list_insert(local_40,pcVar9);
        sVar10 = plVar1->size;
        pcVar9 = (char *)malloc(sVar10 * 8);
        __ptr = (void *)raw_string_length;
        if (pcVar9 != (char *)0x0) {
          pnVar7 = local_40->head;
          if (pnVar7 != (node *)0x0) {
            pcVar8 = pcVar9 + sVar10 * 8;
            do {
              pcVar8 = pcVar8 + -8;
              *(void **)pcVar8 = pnVar7->data;
              pnVar7 = pnVar7->next;
            } while (pnVar7 != (node *)0x0);
          }
          array_string = pcVar9;
          list_destroy(local_40);
          pcVar9 = array_string;
          sVar11 = 0;
          value_items_length = sVar11;
          if (sVar10 != 0) {
            do {
              local_38 = (char *)0x0;
              pcVar8 = *(char **)(pcVar9 + sVar11 * 8);
              nVar3 = string_strip_surrounding_spaces(pcVar8,&local_38,(size_t *)0x0);
              if (nVar3 != NO_ERROR) {
                if ((nVar3 != NOT_FOUND_ERROR) || (sVar10 - 1 != sVar11)) {
                  pcVar6 = (config_value *)0x0;
                  internal_logger(natwm_logger,LEVEL_ERROR,
                                  "Failed to parse array value item \'%s\' - Line %zu",pcVar8,
                                  local_58->line_num);
                  free((void *)raw_string_length);
                  value = pcVar9;
                  goto LAB_00106f58;
                }
                free(pcVar8);
                value_items_length = sVar11;
                __ptr = (void *)raw_string_length;
                break;
              }
              free(pcVar8);
              *(char **)(pcVar9 + sVar11 * 8) = local_38;
              sVar11 = sVar11 + 1;
              value_items_length = sVar10;
              __ptr = (void *)raw_string_length;
            } while (sVar10 != sVar11);
          }
          pcVar9 = array_string;
          pcVar6 = parser_resolve_array_values(local_58,(char **)array_string,value_items_length);
          if (pcVar6 == (config_value *)0x0) {
            free(__ptr);
            goto LAB_00106f0a;
          }
          free(value);
          free(__ptr);
          value = pcVar9;
          goto LAB_00106f58;
        }
      }
      pcVar9 = (char *)raw_string_length;
      for (pnVar7 = local_40->head; pnVar7 != (node *)0x0; pnVar7 = pnVar7->next) {
        if (pnVar7->data != (void *)0x0) {
          free(pnVar7->data);
        }
      }
      list_destroy(local_40);
    }
    value = pcVar9;
    pcVar6 = (config_value *)0x0;
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to parse array value items string - Line %zu",
                    local_58->line_num);
    goto LAB_00106f58;
  default:
    goto switchD_00106d9b_caseD_2;
  case NUMERIC_CHAR:
    local_38 = (char *)0x0;
    nVar3 = string_to_number(value,(intmax_t *)&local_38);
    if (nVar3 == NO_ERROR) {
      pcVar6 = config_value_create_number((intmax_t)local_38);
      goto LAB_00106de5;
    }
    sVar10 = parser->line_num;
    pcVar9 = "Invalid numeric value \'%s\' found - Line %zu";
    break;
  case QUOTE:
    sVar4 = strlen(value);
    local_38 = (char *)0x0;
    nVar3 = string_splice(value,1,sVar4 - 1,&local_38,(size_t *)0x0);
    if (nVar3 == NO_ERROR) {
      pcVar6 = config_value_create_string(local_38);
      pcVar9 = local_38;
      if (pcVar6 == (config_value *)0x0) {
LAB_00106f0a:
        free(pcVar9);
        return (config_value *)0x0;
      }
      goto LAB_00106f58;
    }
    sVar10 = parser->line_num;
    pcVar9 = "Invalid string \'%s\' found - Line %zu";
    break;
  case VARIABLE_START:
    pmVar5 = map_get(parser->variables,value + 1);
    pcVar9 = "\'%s\' is not defined - Line: %zu";
    if ((pmVar5 != (map_entry *)0x0) && ((config_value *)pmVar5->value != (config_value *)0x0)) {
      pcVar6 = config_value_duplicate((config_value *)pmVar5->value);
      if (pcVar6 != (config_value *)0x0) goto LAB_00106f58;
      pcVar9 = "Failed to resolve variable \'%s\' - Line: %zu";
    }
    sVar10 = parser->line_num;
    value = value + 1;
  }
  internal_logger(natwm_logger,LEVEL_ERROR,pcVar9,value,sVar10,in_R9,uVar12);
switchD_00106d9b_caseD_2:
  return (config_value *)0x0;
}

Assistant:

struct config_value *parser_parse_value(struct parser *parser, char *value)
{
        switch (char_to_token(value[0])) {
        case ALPHA_CHAR:
                return parser_parse_boolean(parser, value);
        case ARRAY_START:
                return parser_parse_array(parser, value);
        case NUMERIC_CHAR:
                return parser_parse_number(parser, value);
        case QUOTE:
                return parser_parse_string(parser, value);
        case VARIABLE_START:
                return parser_parse_variable(parser, value);
        default:
                return NULL;
        }
}